

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_rot(lua_State *L,lua_Integer d)

{
  byte bVar1;
  ulong uStack_20;
  int i;
  lua_Unsigned r;
  lua_Integer d_local;
  lua_State *L_local;
  
  uStack_20 = luaL_checkinteger(L,1);
  bVar1 = (byte)d & 0x1f;
  uStack_20 = uStack_20 & 0xffffffff;
  if ((d & 0x1fU) != 0) {
    uStack_20 = uStack_20 << bVar1 | uStack_20 >> (0x20 - bVar1 & 0x3f);
  }
  lua_pushinteger(L,uStack_20 & 0xffffffff);
  return 1;
}

Assistant:

static int b_rot (lua_State *L, lua_Integer d) {
  lua_Unsigned r = checkunsigned(L, 1);
  int i = d & (LUA_NBITS - 1);  /* i = d % NBITS */
  r = trim(r);
  if (i != 0)  /* avoid undefined shift of LUA_NBITS when i == 0 */
    r = (r << i) | (r >> (LUA_NBITS - i));
  pushunsigned(L, trim(r));
  return 1;
}